

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O3

bool __thiscall
jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_uint64(basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
            uint64_t value,semantic_tag tag,ser_context *context,error_code *ec)

{
  size_t *psVar1;
  pointer psVar2;
  int iVar3;
  undefined7 in_register_00000011;
  undefined1 auVar4 [16];
  
  iVar3 = (int)CONCAT71(in_register_00000011,tag);
  if (iVar3 - 6U < 2) {
    auVar4._8_4_ = (int)(value >> 0x20);
    auVar4._0_8_ = value;
    auVar4._12_4_ = 0x45300000;
    visit_double(this,(auVar4._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)value) - 4503599627370496.0),tag,context,ec)
    ;
  }
  else if (iVar3 == 5) {
    binary_stream_sink::push_back(&this->sink_,0xc1);
  }
  write_uint64_value(this,value);
  psVar2 = (this->stack_).
           super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
      ._M_impl.super__Vector_impl_data._M_start != psVar2) {
    psVar1 = &psVar2[-1].index_;
    *psVar1 = *psVar1 + 1;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_uint64(uint64_t value, 
                      semantic_tag tag, 
                      const ser_context& context,
                      std::error_code& ec) override
    {
        switch (tag)
        {
            case semantic_tag::epoch_milli:
            case semantic_tag::epoch_nano:
                visit_double(static_cast<double>(value), tag, context, ec);
                break;
            case semantic_tag::epoch_second:
                write_tag(1);
                break;
            default:
                break;
        }

        write_uint64_value(value);
        end_value();
        JSONCONS_VISITOR_RETURN;
    }